

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::ConfidentialTxOutReference::GetSerializeVsize
          (ConfidentialTxOutReference *this,bool is_blinded,int exponent,int minimum_bits,
          uint32_t *rangeproof_size,uint32_t input_asset_count)

{
  uint32_t uVar1;
  uint32_t no_witness_size;
  uint32_t witness_size;
  
  _no_witness_size = 0;
  GetSerializeSize(this,is_blinded,&witness_size,&no_witness_size,exponent,minimum_bits,
                   rangeproof_size,input_asset_count);
  uVar1 = AbstractTransaction::GetVsizeFromSize(no_witness_size,witness_size);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTxOutReference::GetSerializeVsize(
    bool is_blinded, int exponent, int minimum_bits, uint32_t *rangeproof_size,
    uint32_t input_asset_count) const {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  GetSerializeSize(
      is_blinded, &witness_size, &no_witness_size, exponent, minimum_bits,
      rangeproof_size, input_asset_count);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}